

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindAllExtensionNumbers
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          string *containing_type,vector<int,_std::allocator<int>_> *output)

{
  pointer pcVar1;
  iterator __position;
  string *psVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  bool bVar6;
  _Base_ptr p_Var7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_68;
  string *local_40;
  _Base_ptr local_38;
  
  local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
  pcVar1 = (containing_type->_M_dataplus)._M_p;
  local_40 = containing_type;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + containing_type->_M_string_length);
  local_68.second = 0;
  p_Var7 = (this->by_extension_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->by_extension_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = p_Var5;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      bVar3 = std::
              less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator()((less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)&this->by_extension_,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)(p_Var7 + 1),&local_68);
      if (!bVar3) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar3];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
    operator_delete(local_68.first._M_dataplus._M_p);
  }
  p_Var7 = local_38;
  psVar2 = local_40;
  if ((p_Var5 == local_38) ||
     (__n = p_Var5[1]._M_parent, __n != (_Base_ptr)local_40->_M_string_length)) {
    bVar3 = false;
  }
  else {
    bVar6 = false;
    do {
      if ((__n != (_Base_ptr)0x0) &&
         (iVar4 = bcmp(*(void **)(p_Var5 + 1),(psVar2->_M_dataplus)._M_p,(size_t)__n), iVar4 != 0))
      {
        return bVar6;
      }
      __position._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)output,__position,(int *)(p_Var5 + 2));
      }
      else {
        *__position._M_current = p_Var5[2]._M_color;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      if (p_Var5 == p_Var7) {
        return true;
      }
      __n = p_Var5[1]._M_parent;
      bVar6 = true;
      bVar3 = true;
    } while (__n == (_Base_ptr)psVar2->_M_string_length);
  }
  return bVar3;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::FindAllExtensionNumbers(
    const std::string& containing_type, std::vector<int>* output) {
  typename std::map<std::pair<std::string, int>, Value>::const_iterator it =
      by_extension_.lower_bound(std::make_pair(containing_type, 0));
  bool success = false;

  for (; it != by_extension_.end() && it->first.first == containing_type;
       ++it) {
    output->push_back(it->first.second);
    success = true;
  }

  return success;
}